

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O2

void __thiscall BVFixed::And(BVFixed *this,BVFixed *bv)

{
  AssertBV(this,bv);
  for_each<void(BVUnitT<unsigned_long>::*)(BVUnitT<unsigned_long>)>(this,bv,0x60c146);
  return;
}

Assistant:

void
BVFixed::And(const BVFixed*bv)
{
    AssertBV(bv);
    this->for_each(bv, &BVUnit::And);
}